

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O3

DynamicProfileInfo * __thiscall
Js::SourceDynamicProfileManager::GetDynamicProfileInfo
          (SourceDynamicProfileManager *this,FunctionBody *functionBody)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  SourceContextInfo *pSVar6;
  DynamicProfileInfo *local_30;
  DynamicProfileInfo *dynamicProfileInfo;
  LocalFunctionId functionId;
  
  pFVar5 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar5 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pFVar5 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  dynamicProfileInfo._4_4_ = pFVar5->functionId;
  local_30 = (DynamicProfileInfo *)0x0;
  if ((0 < (this->dynamicProfileInfoMap).count - (this->dynamicProfileInfoMap).freeCount) &&
     (bVar3 = JsUtil::
              BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        (&this->dynamicProfileInfoMap,(uint *)((long)&dynamicProfileInfo + 4),
                         &local_30), bVar3)) {
    bVar3 = DynamicProfileInfo::MatchFunctionBody(local_30,functionBody);
    if (bVar3) {
      return local_30;
    }
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,DynamicProfilePhase);
    uVar2 = dynamicProfileInfo._4_4_;
    if (bVar3) {
      pSVar6 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)functionBody);
      Output::Print(L"TRACE: DynamicProfile: Profile data rejected for function %d in %s\n",
                    (ulong)uVar2,(pSVar6->field_5).field_0.url);
      Output::Flush();
      return (DynamicProfileInfo *)0x0;
    }
  }
  return (DynamicProfileInfo *)0x0;
}

Assistant:

DynamicProfileInfo *
    SourceDynamicProfileManager::GetDynamicProfileInfo(FunctionBody * functionBody)
    {
        Js::LocalFunctionId functionId = functionBody->GetLocalFunctionId();
        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        if (dynamicProfileInfoMap.Count() > 0 && dynamicProfileInfoMap.TryGetValue(functionId, &dynamicProfileInfo))
        {
            if (dynamicProfileInfo->MatchFunctionBody(functionBody))
            {
                return dynamicProfileInfo;
            }

#if DBG_DUMP
            if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::DynamicProfilePhase))
            {
                Output::Print(_u("TRACE: DynamicProfile: Profile data rejected for function %d in %s\n"),
                    functionId, functionBody->GetSourceContextInfo()->url);
                Output::Flush();
            }
#endif
            // NOTE: We have profile mismatch, we can invalidate all other profile here.
        }
        return nullptr;
    }